

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O0

void undo_flood(int x,int y,void *roomcnt)

{
  level *plVar1;
  rm *loc;
  void *roomcnt_local;
  int y_local;
  int x_local;
  
  plVar1 = level;
  if ((((level->locations[x][y].typ == '\x11') || (level->locations[x][y].typ == '\x12')) ||
      (level->locations[x][y].typ == '\x13')) || (level->locations[x][y].typ == '\x1c')) {
    *(int *)roomcnt = *roomcnt + 1;
    plVar1->locations[x][y].typ = '\x19';
    newsym(x,y);
  }
  return;
}

Assistant:

static void undo_flood(int x, int y, void *roomcnt)
{
	struct rm *loc = &level->locations[x][y];

	if (loc->typ != POOL &&
	    loc->typ != MOAT &&
	    loc->typ != WATER &&
	    loc->typ != FOUNTAIN)
	    return;

	(*(int *)roomcnt)++;

	/* Get rid of a pool at x, y */
	loc->typ = ROOM;
	newsym(x, y);
}